

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O1

bool __thiscall
kws::Parser::IsBetweenQuoteChar
          (Parser *this,size_t pos,bool withComments,string *buffer,char quoteChar)

{
  pointer pcVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 *puVar5;
  ulong uVar6;
  uint uVar7;
  string stream;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pcVar1 = (buffer->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + buffer->_M_string_length);
  if ((buffer->_M_string_length == 0) &&
     (std::__cxx11::string::_M_assign((string *)local_50), withComments)) {
    std::__cxx11::string::_M_assign((string *)local_50);
  }
  if (pos != 0xffffffffffffffff) {
    uVar7 = (uint)quoteChar;
    uVar3 = std::__cxx11::string::find((char)local_50,(ulong)uVar7);
    if (uVar3 != 0xffffffffffffffff) {
      while (1 < uVar3 + 1) {
        uVar4 = 0;
        puVar5 = local_50[0];
        do {
          puVar5 = puVar5 + -1;
          if (puVar5[uVar3] != '\\') goto LAB_00124bbd;
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
        uVar4 = uVar3 & 0xffffffff;
LAB_00124bbd:
        if (((uVar4 & 1) == 0) ||
           (uVar3 = std::__cxx11::string::find((char)local_50,(ulong)uVar7),
           uVar3 == 0xffffffffffffffff)) break;
      }
    }
    uVar4 = std::__cxx11::string::find((char)local_50,(ulong)uVar7);
    if (uVar4 != 0xffffffffffffffff) {
      while (1 < uVar4 + 1) {
        uVar6 = 0;
        puVar5 = local_50[0];
        do {
          puVar5 = puVar5 + -1;
          if (puVar5[uVar4] != '\\') goto LAB_00124c16;
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
        uVar6 = uVar4 & 0xffffffff;
LAB_00124c16:
        if (((uVar6 & 1) == 0) ||
           (uVar4 = std::__cxx11::string::find((char)local_50,(ulong)uVar7),
           uVar4 == 0xffffffffffffffff)) break;
      }
    }
    if (uVar3 < uVar4 && uVar4 != 0xffffffffffffffff) {
      while (bVar2 = pos < uVar4 && uVar3 < pos, pos >= uVar4 || uVar3 >= pos) {
        do {
          uVar3 = std::__cxx11::string::find((char)local_50,(ulong)uVar7);
          if ((uVar3 == 0xffffffffffffffff) || (uVar3 + 1 < 2)) break;
          uVar4 = 0;
          puVar5 = local_50[0];
          do {
            puVar5 = puVar5 + -1;
            if (puVar5[uVar3] != '\\') goto LAB_00124c9d;
            uVar4 = uVar4 + 1;
          } while (uVar3 != uVar4);
          uVar4 = uVar3 & 0xffffffff;
LAB_00124c9d:
        } while ((uVar4 & 1) != 0);
        do {
          uVar4 = std::__cxx11::string::find((char)local_50,(ulong)uVar7);
          if ((uVar4 == 0xffffffffffffffff) || (uVar4 + 1 < 2)) break;
          uVar6 = 0;
          puVar5 = local_50[0];
          do {
            puVar5 = puVar5 + -1;
            if (puVar5[uVar4] != '\\') goto LAB_00124ce3;
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
          uVar6 = uVar4 & 0xffffffff;
LAB_00124ce3:
        } while ((uVar6 & 1) != 0);
        if ((uVar4 <= uVar3) || (uVar4 == 0xffffffffffffffff)) break;
      }
      goto LAB_00124cfc;
    }
  }
  bVar2 = false;
LAB_00124cfc:
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return bVar2;
}

Assistant:

bool Parser::IsBetweenQuoteChar(size_t pos,bool withComments,std::string buffer, char quoteChar) const
{
  std::string stream = buffer;

  if (buffer.empty()) {
    stream = m_BufferNoComment;
    if(withComments)
      {
      stream = m_Buffer;
      }
  }

  if(pos == std::string::npos)
    {
    return false;
    }

  // We don't want to check for \" otherwise it fails
  size_t b0 = stream.find(quoteChar,0);
  while((b0!=std::string::npos) && !this->IsValidQuote(stream,b0))
    {
    b0 = stream.find(quoteChar,b0+1);
    }

  size_t b1 = stream.find(quoteChar,b0+1);
  while((b1!=std::string::npos) && !this->IsValidQuote(stream,b1))
    {
    b1 = stream.find(quoteChar,b1+1);
    }

  while(b0 != std::string::npos && b1 != std::string::npos && b1>b0)
    {
    if(pos>b0 && pos<b1)
      {
      return true;
      }
    b0 = stream.find(quoteChar,b1+1);
    while((b0!=std::string::npos) && !this->IsValidQuote(stream,b0))
      {
      b0 = stream.find(quoteChar,b0+1);
      }

    b1 = stream.find(quoteChar,b0+1);
    while((b1!=std::string::npos) && !this->IsValidQuote(stream,b1))
      {
      b1 = stream.find(quoteChar,b1+1);
      }
    }
  return false;
}